

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O0

void y_object_suite::y_object_escaped_null_in_key(void)

{
  undefined4 local_1f0;
  value local_1ec [2];
  undefined4 local_1e4;
  value local_1e0 [2];
  undefined4 local_1d8;
  int local_1d4 [2];
  undefined4 local_1cc;
  value local_1c8 [2];
  view_type local_1c0;
  undefined4 local_1a8;
  value local_1a4 [6];
  undefined4 local_18c;
  value local_188 [2];
  basic_string_view<char,_std::char_traits<char>_> local_180;
  undefined1 local_170 [8];
  reader reader;
  char input [21];
  
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x30755c6f6f66227b;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_180,
             (char *)&reader.stack.c.
                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_170,&local_180);
  local_188[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_170);
  local_18c = 0xe;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xcd8,"void y_object_suite::y_object_escaped_null_in_key()",local_188,&local_18c);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_170);
  local_1a4[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_170);
  local_1a8 = 0xb;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::key",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xcda,"void y_object_suite::y_object_escaped_null_in_key()",local_1a4,&local_1a8);
  local_1c0 = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_170);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[15]>
            ("reader.literal()","\"\\\"foo\\\\u0000bar\\\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xcdb,"void y_object_suite::y_object_escaped_null_in_key()",&local_1c0,
             "\"foo\\u0000bar\"");
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_170);
  local_1c8[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_170);
  local_1cc = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xcdd,"void y_object_suite::y_object_escaped_null_in_key()",local_1c8,&local_1cc);
  local_1d4[0] = trial::protocol::json::basic_reader<char>::value<int>
                           ((basic_reader<char> *)local_170);
  local_1d8 = 0x2a;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("reader.value<int>()","42",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xcde,"void y_object_suite::y_object_escaped_null_in_key()",local_1d4,&local_1d8);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_170);
  local_1e0[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_170);
  local_1e4 = 0xf;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xce0,"void y_object_suite::y_object_escaped_null_in_key()",local_1e0,&local_1e4);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_170);
  local_1ec[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_170);
  local_1f0 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xce2,"void y_object_suite::y_object_escaped_null_in_key()",local_1ec,&local_1f0);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_170);
  return;
}

Assistant:

void y_object_escaped_null_in_key()
{
    const char input[] = "{\"foo\\u0000bar\": 42}";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_object);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::key);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "\"foo\\u0000bar\"");
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<int>(), 42);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_object);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}